

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void printInDevices(void)

{
  int iVar1;
  char **in_RAX;
  void *__ptr;
  void *__ptr_00;
  char *__s1;
  char *pcVar2;
  char **ppcVar3;
  char **hints;
  
  hints = in_RAX;
  iVar1 = snd_device_name_hint(0,"pcm",&hints);
  ppcVar3 = hints;
  if (iVar1 != 0) {
    fwrite("Can\'t read data\n",0x10,1,_stderr);
    exit(1);
  }
  do {
    if (*ppcVar3 == (char *)0x0) {
      snd_device_name_free_hint(hints);
      snd_config_update_free_global();
      return;
    }
    __ptr = (void *)snd_device_name_get_hint(*ppcVar3,"NAME");
    __ptr_00 = (void *)snd_device_name_get_hint(*ppcVar3,"DESC");
    __s1 = (char *)snd_device_name_get_hint(*ppcVar3,"IOID");
    if (__ptr_00 != (void *)0x0 && __ptr != (void *)0x0) {
      pcVar2 = "Input/Output";
      if (__s1 != (char *)0x0) {
        iVar1 = strcmp(__s1,"Input");
        pcVar2 = "Input";
        if (iVar1 != 0) goto LAB_001024f2;
      }
      printf("%s\n%s: <%s>\n\n",__ptr_00,pcVar2,__ptr);
    }
LAB_001024f2:
    free(__ptr);
    if (__ptr != (void *)0x0) {
      free(__ptr_00);
      free(__s1);
    }
    ppcVar3 = ppcVar3 + 1;
  } while( true );
}

Assistant:

void printInDevices() {
    char **hints;
    /* Enumerate sound devices */
    int err = snd_device_name_hint(0, "pcm", (void***)&hints);
    if (err != 0) {
        fprintf(stderr, "Can't read data\n");
        exit(EXIT_FAILURE);
    }

    char** n = hints;
    while (*n != NULL) {
        char *name = snd_device_name_get_hint(*n, "NAME");
        char *desc = snd_device_name_get_hint(*n, "DESC");
        char *type = snd_device_name_get_hint(*n, "IOID");
        if (name != NULL && desc != NULL) {
            if (type == NULL || !strcmp(type, "Input")) {
                printf("%s\n%s: <%s>\n\n", desc, type == NULL ? "Input/Output" : "Input",name);
            }
        }
        if (name != NULL) free(name);
        if (name != NULL) free(desc);
        if (name != NULL) free(type);
        n++;
    }

    //Free hint buffer too
    snd_device_name_free_hint((void**)hints);
    snd_config_update_free_global();
}